

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O1

void __thiscall
gimage::JPEGImageIO::load
          (JPEGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  FILE *pFVar4;
  ulong uVar5;
  IOException *pIVar6;
  long *plVar7;
  sbyte sVar8;
  void *pvVar9;
  size_type *psVar10;
  size_t __n;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  JSAMPROW row;
  jpeg_decompress_struct cinfo;
  jpeg_error_mgr jerr;
  allocator local_461;
  ulong local_460;
  ulong local_458;
  void *local_450;
  void *local_448;
  void *local_440;
  long local_438;
  ulong local_430;
  long local_428;
  FILE *local_420;
  ulong local_418;
  ulong local_410;
  long local_408;
  long local_400;
  ulong local_3f8;
  string local_3f0;
  ulong local_3d0;
  long local_3c8;
  void *local_3c0;
  void *local_3b8;
  ulong local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined8 local_368 [9];
  undefined4 local_320;
  uint local_2e0;
  uint local_2dc;
  uint local_2d4;
  uint local_2c0;
  undefined1 local_d8 [168];
  
  local_450 = (void *)0x0;
  local_438 = y;
  local_428 = x;
  iVar3 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar3 == '\0') {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_3a8,name,&local_461);
    std::operator+(&local_388,"Can only load JPG image (",&local_3a8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
    local_3f0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_3f0._M_dataplus._M_p == psVar10) {
      local_3f0.field_2._M_allocated_capacity = *psVar10;
      local_3f0.field_2._8_8_ = plVar7[3];
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    }
    else {
      local_3f0.field_2._M_allocated_capacity = *psVar10;
    }
    local_3f0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    gutil::IOException::IOException(pIVar6,&local_3f0);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pFVar4 = fopen(name,"rb");
  if (pFVar4 == (FILE *)0x0) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_3a8,name,&local_461);
    std::operator+(&local_388,"Cannot open file for reading (",&local_3a8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_388);
    local_3f0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_3f0._M_dataplus._M_p == psVar10) {
      local_3f0.field_2._M_allocated_capacity = *psVar10;
      local_3f0.field_2._8_8_ = plVar7[3];
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    }
    else {
      local_3f0.field_2._M_allocated_capacity = *psVar10;
    }
    local_3f0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    gutil::IOException::IOException(pIVar6,&local_3f0);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_458 = w;
  local_368[0] = jpeg_std_error(local_d8);
  jpeg_CreateDecompress(local_368,0x50,0x290);
  local_420 = pFVar4;
  jpeg_stdio_src(local_368,pFVar4);
  jpeg_read_header(local_368,1);
  uVar13 = 1;
  if (1 < ds) {
    if ((ds & 7U) == 0) {
      sVar8 = 3;
      local_320 = 8;
    }
    else if ((ds & 3U) == 0) {
      sVar8 = 2;
      local_320 = 4;
    }
    else {
      uVar13 = ds;
      if ((ds & 1U) != 0) goto LAB_0014c2f7;
      sVar8 = 1;
      local_320 = 2;
    }
    uVar13 = (uint)ds >> sVar8;
  }
LAB_0014c2f7:
  jpeg_start_decompress(local_368);
  uVar20 = (ulong)local_2e0;
  local_460 = (ulong)local_2dc;
  lVar19 = (long)(int)local_2d4;
  if (w < 0) {
    local_458 = (long)(uVar13 + uVar20 + -1) / (long)(ulong)uVar13;
  }
  if (h < 0) {
    h = (long)(local_460 + uVar13 + -1) / (long)(ulong)uVar13;
  }
  local_418 = h;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,local_458,h,lVar19);
  sVar2 = image->n;
  __n = -sVar2;
  if (0 < (long)sVar2) {
    __n = sVar2;
  }
  memset(image->pixel,0,__n);
  uVar14 = local_418;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)(lVar19 * uVar20)) {
    uVar5 = lVar19 * uVar20;
  }
  local_450 = operator_new__(uVar5);
  if ((((local_438 == 0 && local_428 == 0) && (uVar13 < 2)) && (local_458 == uVar20)) &&
     (uVar14 == local_460)) {
    if (local_460 != 0) {
      uVar14 = 0;
      do {
        jpeg_read_scanlines(local_368,&local_450,1);
        if (local_2e0 != 0) {
          uVar5 = 0;
          iVar3 = 0;
          do {
            if (0 < (int)local_2d4) {
              uVar11 = 0;
              do {
                image->img[uVar11][uVar14][uVar5] =
                     *(uchar *)((long)local_450 + uVar11 + (long)iVar3);
                uVar11 = uVar11 + 1;
              } while (local_2d4 != uVar11);
              iVar3 = iVar3 + (int)uVar11;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar20);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_460);
    }
    jpeg_finish_decompress(local_368);
    pFVar4 = local_420;
  }
  else {
    local_430 = CONCAT44(local_430._4_4_,uVar13);
    lVar18 = local_458 * lVar19;
    uVar14 = lVar18 * 4;
    local_448 = operator_new(uVar14);
    local_408 = lVar18;
    if (lVar18 != 0) {
      memset(local_448,0,uVar14);
    }
    local_440 = operator_new(uVar14);
    uVar5 = local_430;
    if (local_408 != 0) {
      memset(local_440,0,uVar14);
    }
    uVar5 = uVar5 & 0xffffffff;
    lVar18 = uVar5 * local_438;
    local_3d0 = uVar14;
    if ((0 < lVar18) && ((int)local_460 != 0)) {
      uVar14 = 1;
      do {
        jpeg_read_scanlines(local_368,&local_450,1);
        if (lVar18 <= (long)uVar14) break;
        bVar21 = uVar14 < local_460;
        uVar14 = uVar14 + 1;
      } while (bVar21);
    }
    uVar14 = 0;
    if (-local_438 != 0 && local_438 < 1) {
      uVar14 = -local_438;
    }
    if ((long)uVar14 < (long)local_418) {
      iVar3 = 0;
      if (0 < local_428) {
        iVar3 = (int)local_428;
      }
      local_3b0 = (ulong)(iVar3 * (int)local_430 * local_2d4);
      local_410 = -local_428;
      if (-local_428 == 0 || 0 < local_428) {
        local_410 = 0;
      }
      local_3c8 = local_410 * lVar19;
      local_3b8 = (void *)((long)local_440 + local_3c8 * 4);
      local_430 = lVar19 << 2;
      local_3c0 = (void *)((long)local_448 + local_3c8 * 4);
      do {
        uVar11 = local_3d0;
        local_400 = (uVar14 + local_438) * uVar5;
        if ((long)local_460 <= local_400) break;
        local_3f8 = uVar14;
        if (local_408 != 0) {
          memset(local_448,0,local_3d0);
          memset(local_440,0,uVar11);
        }
        if (local_400 < (long)local_460) {
          uVar14 = 0;
          do {
            jpeg_read_scanlines(local_368,&local_450,1);
            pvVar9 = local_3c0;
            pvVar12 = local_3b8;
            uVar11 = local_410;
            uVar15 = local_3b0;
            if ((long)local_410 < (long)local_458) {
              do {
                lVar19 = (local_428 + uVar11) * uVar5;
                if ((long)uVar20 <= lVar19) break;
                uVar16 = 0;
                do {
                  if (0 < (int)local_2d4) {
                    uVar17 = 0;
                    do {
                      piVar1 = (int *)((long)pvVar9 + uVar17 * 4);
                      *piVar1 = *piVar1 + (uint)*(byte *)((long)local_450 +
                                                         uVar17 + (long)(int)uVar15);
                      piVar1 = (int *)((long)pvVar12 + uVar17 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar17 = uVar17 + 1;
                    } while (local_2d4 != uVar17);
                    uVar15 = (ulong)(uint)((int)uVar15 + (int)uVar17);
                  }
                } while ((uVar16 + 1 < uVar5) &&
                        (lVar18 = lVar19 + uVar16, uVar16 = uVar16 + 1, lVar18 + 1 < (long)uVar20));
                uVar11 = uVar11 + 1;
                pvVar9 = (void *)((long)pvVar9 + local_430);
                pvVar12 = (void *)((long)pvVar12 + local_430);
              } while (uVar11 != local_458);
            }
          } while ((uVar14 + 1 < uVar5) &&
                  (lVar19 = local_400 + uVar14, uVar14 = uVar14 + 1, lVar19 + 1 < (long)local_460));
        }
        uVar14 = local_410;
        lVar19 = local_3c8;
        if ((long)local_410 < (long)local_458) {
          do {
            if ((long)uVar20 <= (long)((local_428 + uVar14) * uVar5)) break;
            if (0 < (int)local_2d4) {
              uVar11 = 0;
              do {
                iVar3 = *(int *)((long)local_440 + uVar11 * 4 + lVar19 * 4);
                if (0 < iVar3) {
                  image->img[uVar11][local_3f8][uVar14] =
                       (uchar)(*(int *)((long)local_448 + uVar11 * 4 + lVar19 * 4) / iVar3);
                }
                uVar11 = uVar11 + 1;
              } while (local_2d4 != uVar11);
              lVar19 = lVar19 + uVar11;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_458);
        }
        uVar14 = local_3f8 + 1;
      } while (uVar14 != local_418);
    }
    pvVar9 = local_448;
    if (local_2c0 < local_2dc) {
      jpeg_abort_decompress(local_368);
    }
    else {
      jpeg_finish_decompress(local_368);
    }
    pFVar4 = local_420;
    operator_delete(local_440);
    operator_delete(pvVar9);
  }
  jpeg_destroy_decompress(local_368);
  fclose(pFVar4);
  if (local_450 != (void *)0x0) {
    operator_delete__(local_450);
  }
  return;
}

Assistant:

void JPEGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                       long w, long h) const
{
  long  width, height;
  int   depth;
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  JSAMPROW row=0;
  FILE   *in=0;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load JPG image ("+std::string(name)+")");
  }

  // open output file using C methods

  in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file for reading ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  jpeg_stdio_src(&cinfo, in);

  // read header information

  jpeg_read_header(&cinfo, TRUE);

  // use scaling possibility of JPEG library for increasing speed

  ds=std::max(1, ds);

  if (ds > 1)
  {
    if (ds%8 == 0)
    {
      cinfo.scale_denom=8;
      ds/=8;
    }
    else if (ds%4 == 0)
    {
      cinfo.scale_denom=4;
      ds/=4;
    }
    else if (ds%2 == 0)
    {
      cinfo.scale_denom=2;
      ds/=2;
    }
  }

  // start decompression

  jpeg_start_decompress(&cinfo);

  // get size and depth

  width=static_cast<long>(cinfo.output_width);
  height=static_cast<long>(cinfo.output_height);
  depth=cinfo.output_components;

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // allocate image row buffer

  row=new JSAMPLE [width*depth];

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    for (long k=0; k<y*ds && k<height; k++)
    {
      jpeg_read_scanlines(&cinfo, &row, 1);
    }

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        jpeg_read_scanlines(&cinfo, &row, 1);

        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
          }

          j++;
        }
      }
    }

    if (cinfo.output_scanline < cinfo.output_height)
    {
      jpeg_abort_decompress(&cinfo);
    }
    else
    {
      jpeg_finish_decompress(&cinfo);
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      jpeg_read_scanlines(&cinfo, &row, 1);

      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[j++]));
        }
      }
    }

    jpeg_finish_decompress(&cinfo);
  }

  // close object and input stream

  jpeg_destroy_decompress(&cinfo);
  fclose(in);
  delete [] row;
}